

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O2

void process_line(BinarySource *in,strbuf *out)

{
  ptrlen P;
  undefined1 auVar1 [16];
  _Bool _Var2;
  _Bool _Var6;
  uint uVar7;
  int iVar8;
  TD_rsaorder TVar9;
  TD_argon2flavour TVar10;
  PockleStatus status;
  uchar uVar3;
  uchar uVar4;
  byte bVar5;
  Value *pVVar11;
  strbuf *psVar12;
  ulong uVar13;
  mp_int *pmVar14;
  size_t sVar15;
  uintmax_t uVar16;
  uintmax_t uVar17;
  mp_int *pmVar18;
  mp_int *pmVar19;
  TD_opt_val_mpint pmVar20;
  TD_opt_val_mpint pmVar21;
  TD_opt_val_mpint B;
  ModsqrtContext *pMVar22;
  uint *puVar23;
  MontyContext *pMVar24;
  WeierstrassCurve *pWVar25;
  WeierstrassPoint *pWVar26;
  WeierstrassPoint *pWVar27;
  mp_int **ppmVar28;
  mp_int **ppmVar29;
  MontgomeryCurve *pMVar30;
  MontgomeryPoint *pMVar31;
  MontgomeryPoint *Q;
  MontgomeryPoint *PminusQ;
  EdwardsCurve *pEVar32;
  EdwardsPoint *pEVar33;
  EdwardsPoint *pEVar34;
  TD_hashalg psVar35;
  ssh_hash *psVar36;
  ssh_hash *v;
  void *pvVar37;
  ssh2_mac *psVar38;
  TD_keyalg psVar39;
  ssh_key *psVar40;
  BinarySource *pBVar41;
  BinarySink *pBVar42;
  ssh_keyalg *psVar43;
  key_components *pkVar44;
  void *pvVar45;
  ssh_cipher *psVar46;
  dh_ctx *pdVar47;
  ecdh_key *peVar48;
  int16_list *piVar49;
  int16_list *piVar50;
  uintmax_t uVar51;
  NTRUEncodeSchedule *pNVar52;
  NTRUKeyPair *pNVar53;
  RSAKey *pRVar54;
  prng *ppVar55;
  char **ppcVar56;
  char **ppcVar57;
  char **errorstr;
  BinarySource *pBVar58;
  uintmax_t uVar59;
  PrimeGenerationContext *pPVar60;
  PrimeCandidateSource *pPVar61;
  mp_int **addend_out;
  Pockle *pPVar62;
  MillerRabin *pMVar63;
  mr_result mVar64;
  char *pcVar65;
  _func_void_ssh_key_ptr_BinarySink_ptr *UNRECOVERED_JUMPTABLE;
  size_t __n;
  char *pcVar66;
  ARGS_http_digest_response *in_00;
  size_t i;
  size_t i_1;
  bool bVar67;
  ptrlen pVar68;
  ptrlen pl;
  ptrlen pl_00;
  ptrlen pl_01;
  ptrlen pl_02;
  ptrlen pl_03;
  ptrlen pVar69;
  ptrlen pVar70;
  ptrlen pVar71;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined1 local_180 [2];
  _Bool _Stack_17e;
  undefined1 auStack_17d [13];
  BinarySink *local_170;
  uintmax_t local_168;
  size_t local_160;
  size_t local_158;
  void *local_150;
  size_t sStack_148;
  ptrlen local_140;
  ARGS_http_digest_response _args;
  
  pVar69 = get_word(in);
  pBVar41 = (BinarySource *)pVar69.ptr;
  _Var2 = ptrlen_eq_string(pVar69,"hello");
  if (_Var2) {
    pcVar66 = "hello, world\n";
    goto LAB_0010aeab;
  }
  _Var2 = ptrlen_eq_string(pVar69,"free");
  if (_Var2) {
    pVVar11 = get_value(in);
    del234(values,pVVar11);
    free_value(pVVar11);
    return;
  }
  _Var2 = ptrlen_eq_string(pVar69,"newstring");
  if (_Var2) {
    psVar12 = strbuf_new();
    while (pBVar41 = in->binarysource_, pBVar41->len != pBVar41->pos) {
      uVar3 = BinarySource_get_byte(pBVar41);
      if (uVar3 == '%') {
        uVar4 = BinarySource_get_byte(in->binarysource_);
        _args._predummy_response._0_1_ = uVar4;
        uVar3 = '%';
        if (uVar4 != '%') {
          uVar3 = BinarySource_get_byte(in->binarysource_);
          auVar1 = (undefined1  [16])_args._0_16_;
          _args._predummy_response._1_1_ = uVar3;
          _args._3_13_ = auVar1._3_13_;
          _args._predummy_response._2_1_ = 0;
          uVar13 = strtoul((char *)&_args,(char **)0x0,0x10);
          uVar3 = (uchar)uVar13;
        }
      }
      BinarySink_put_byte(psVar12->binarysink_,uVar3);
    }
    goto LAB_0010b019;
  }
  _Var2 = ptrlen_eq_string(pVar69,"getstring");
  if (_Var2) {
    psVar12 = get_val_string(in);
    for (uVar13 = 0; uVar13 < psVar12->len; uVar13 = uVar13 + 1) {
      uVar3 = psVar12->s[uVar13];
      if ((byte)(uVar3 - 0x21) < 0x5e && uVar3 != '%') {
        BinarySink_put_byte(out->binarysink_,uVar3);
      }
      else {
        BinarySink_put_fmt(out->binarysink_,"%%%02X");
      }
    }
LAB_0010b0ea:
    BinarySink_put_byte(out->binarysink_,'\n');
    return;
  }
  _Var2 = ptrlen_eq_string(pVar69,"mp_literal");
  if (_Var2) {
    pVar69 = get_word(in);
    pcVar66 = mkstr(pVar69);
    if ((*pcVar66 == '\0') || ((byte)(pcVar66[1] | 0x20U) != 0x78)) {
      pmVar14 = mp_from_decimal(pcVar66);
    }
    else {
      pmVar14 = mp_from_hex(pcVar66 + 2);
    }
    safefree(pcVar66);
    goto LAB_0010b11f;
  }
  _Var2 = ptrlen_eq_string(pVar69,"mp_dump");
  if (_Var2) {
    pmVar14 = get_val_mpint(in);
    sVar15 = mp_max_bytes(pmVar14);
    while (sVar15 = sVar15 - 1, sVar15 != 0xffffffffffffffff) {
      bVar5 = mp_get_byte(pmVar14,sVar15);
      BinarySink_put_fmt(out->binarysink_,"%02X",(ulong)bVar5);
    }
    goto LAB_0010b0ea;
  }
  _Var2 = ptrlen_eq_string(pVar69,"checkenum");
  if (_Var2) {
    pVar69 = get_word(in);
    pVar70 = get_word(in);
    _Var2 = ptrlen_eq_string(pVar69,"hashalg");
    if (_Var2) {
      _Var2 = enum_translate_hashalg(pVar70,(TD_hashalg *)0x0);
    }
    else {
      _Var2 = false;
    }
    _Var6 = ptrlen_eq_string(pVar69,"macalg");
    if (_Var6) {
      _Var2 = enum_translate_macalg(pVar70,(TD_macalg *)0x0);
    }
    _Var6 = ptrlen_eq_string(pVar69,"keyalg");
    if (_Var6) {
      _Var2 = enum_translate_keyalg(pVar70,(TD_keyalg *)0x0);
    }
    _Var6 = ptrlen_eq_string(pVar69,"cipheralg");
    if (_Var6) {
      _Var2 = enum_translate_cipheralg(pVar70,(TD_cipheralg *)0x0);
    }
    _Var6 = ptrlen_eq_string(pVar69,"dh_group");
    if (_Var6) {
      _Var2 = enum_translate_dh_group(pVar70,(TD_dh_group *)0x0);
    }
    _Var6 = ptrlen_eq_string(pVar69,"ecdh_alg");
    if (_Var6) {
      _Var2 = enum_translate_ecdh_alg(pVar70,(TD_ecdh_alg *)0x0);
    }
    _Var6 = ptrlen_eq_string(pVar69,"rsaorder");
    if (_Var6) {
      _Var2 = enum_translate_rsaorder(pVar70,(TD_rsaorder *)0x0);
    }
    _Var6 = ptrlen_eq_string(pVar69,"primegenpolicy");
    if (_Var6) {
      _Var2 = enum_translate_primegenpolicy(pVar70,(TD_primegenpolicy *)0x0);
    }
    _Var6 = ptrlen_eq_string(pVar69,"argon2flavour");
    if (_Var6) {
      _Var2 = enum_translate_argon2flavour(pVar70,(TD_argon2flavour *)0x0);
    }
    _Var6 = ptrlen_eq_string(pVar69,"fptype");
    if (_Var6) {
      _Var2 = enum_translate_fptype(pVar70,(TD_fptype *)0x0);
    }
    _Var6 = ptrlen_eq_string(pVar69,"httpdigesthash");
    if (_Var6) {
      _Var2 = enum_translate_httpdigesthash(pVar70,(TD_httpdigesthash *)0x0);
    }
    pBVar42 = out->binarysink_;
    pcVar66 = "bad\n";
    if (_Var2 != false) {
      pcVar66 = "ok\n";
    }
    pVar69.len = 4 - (ulong)_Var2;
    pVar69.ptr = pcVar66;
LAB_0010b35d:
    BinarySink_put_datapl(pBVar42,pVar69);
    return;
  }
  _Var2 = ptrlen_eq_string(pVar69,"mp_new");
  if (_Var2) {
    uVar16 = get_uint(in);
    pmVar14 = mp_new(uVar16);
LAB_0010b11f:
    return_val_mpint(out,pmVar14);
    return;
  }
  _Var2 = ptrlen_eq_string(pVar69,"mp_clear");
  if (_Var2) {
    pmVar14 = get_val_mpint(in);
    mp_clear(pmVar14);
    return;
  }
  _Var2 = ptrlen_eq_string(pVar69,"mp_from_bytes_le");
  if (_Var2) {
    pVar69 = get_val_string_ptrlen(in);
    pmVar14 = mp_from_bytes_le(pVar69);
    goto LAB_0010b11f;
  }
  _Var2 = ptrlen_eq_string(pVar69,"mp_from_bytes_be");
  if (_Var2) {
    pVar69 = get_val_string_ptrlen(in);
    pmVar14 = mp_from_bytes_be(pVar69);
    goto LAB_0010b11f;
  }
  _Var2 = ptrlen_eq_string(pVar69,"mp_from_integer");
  if (_Var2) {
    uVar16 = get_uint(in);
    pmVar14 = mp_from_integer(uVar16);
    goto LAB_0010b11f;
  }
  _Var2 = ptrlen_eq_string(pVar69,"mp_from_decimal_pl");
  if (_Var2) {
    pVar69 = get_val_string_ptrlen(in);
    pmVar14 = mp_from_decimal_pl(pVar69);
    goto LAB_0010b11f;
  }
  _Var2 = ptrlen_eq_string(pVar69,"mp_from_decimal");
  if (_Var2) {
    pcVar66 = get_val_string_asciz(in);
    pmVar14 = mp_from_decimal(pcVar66);
    goto LAB_0010b11f;
  }
  _Var2 = ptrlen_eq_string(pVar69,"mp_from_hex_pl");
  if (_Var2) {
    pVar69 = get_val_string_ptrlen(in);
    pmVar14 = mp_from_hex_pl(pVar69);
    goto LAB_0010b11f;
  }
  _Var2 = ptrlen_eq_string(pVar69,"mp_from_hex");
  if (_Var2) {
    pcVar66 = get_val_string_asciz(in);
    pmVar14 = mp_from_hex(pcVar66);
    goto LAB_0010b11f;
  }
  _Var2 = ptrlen_eq_string(pVar69,"mp_copy");
  if (_Var2) {
    pmVar14 = get_val_mpint(in);
    pmVar14 = mp_copy(pmVar14);
    goto LAB_0010b11f;
  }
  _Var2 = ptrlen_eq_string(pVar69,"mp_power_2");
  if (_Var2) {
    uVar16 = get_uint(in);
    pmVar14 = mp_power_2(uVar16);
    goto LAB_0010b11f;
  }
  _Var2 = ptrlen_eq_string(pVar69,"mp_get_byte");
  if (_Var2) {
    pmVar14 = get_val_mpint(in);
    uVar16 = get_uint(in);
    bVar5 = mp_get_byte(pmVar14,uVar16);
    sVar15 = (size_t)bVar5;
    goto LAB_0010b5ab;
  }
  _Var2 = ptrlen_eq_string(pVar69,"mp_get_bit");
  if (_Var2) {
    pmVar14 = get_val_mpint(in);
    uVar16 = get_uint(in);
    uVar7 = mp_get_bit(pmVar14,uVar16);
  }
  else {
    _Var2 = ptrlen_eq_string(pVar69,"mp_set_bit");
    if (_Var2) {
      pmVar14 = get_val_mpint(in);
      uVar16 = get_uint(in);
      uVar17 = get_uint(in);
      mp_set_bit(pmVar14,uVar16,(uint)uVar17);
      return;
    }
    _Var2 = ptrlen_eq_string(pVar69,"mp_max_bytes");
    if (_Var2) {
      pmVar14 = get_val_mpint(in);
      sVar15 = mp_max_bytes(pmVar14);
      goto LAB_0010b5ab;
    }
    _Var2 = ptrlen_eq_string(pVar69,"mp_max_bits");
    if (_Var2) {
      pmVar14 = get_val_mpint(in);
      sVar15 = mp_max_bits(pmVar14);
      goto LAB_0010b5ab;
    }
    _Var2 = ptrlen_eq_string(pVar69,"mp_get_nbits");
    if (_Var2) {
      pmVar14 = get_val_mpint(in);
      sVar15 = mp_get_nbits(pmVar14);
      goto LAB_0010b5ab;
    }
    _Var2 = ptrlen_eq_string(pVar69,"mp_get_decimal");
    if (_Var2) {
      pmVar14 = get_val_mpint(in);
      pcVar66 = mp_get_decimal(pmVar14);
LAB_0010b70a:
      return_val_string_asciz(out,pcVar66);
      return;
    }
    _Var2 = ptrlen_eq_string(pVar69,"mp_get_hex");
    if (_Var2) {
      pmVar14 = get_val_mpint(in);
      pcVar66 = mp_get_hex(pmVar14);
      goto LAB_0010b70a;
    }
    _Var2 = ptrlen_eq_string(pVar69,"mp_get_hex_uppercase");
    if (_Var2) {
      pmVar14 = get_val_mpint(in);
      pcVar66 = mp_get_hex_uppercase(pmVar14);
      goto LAB_0010b70a;
    }
    _Var2 = ptrlen_eq_string(pVar69,"mp_cmp_hs");
    if (_Var2) {
      pmVar14 = get_val_mpint(in);
      pmVar18 = get_val_mpint(in);
      uVar7 = mp_cmp_hs(pmVar14,pmVar18);
    }
    else {
      _Var2 = ptrlen_eq_string(pVar69,"mp_cmp_eq");
      if (_Var2) {
        pmVar14 = get_val_mpint(in);
        pmVar18 = get_val_mpint(in);
        uVar7 = mp_cmp_eq(pmVar14,pmVar18);
      }
      else {
        _Var2 = ptrlen_eq_string(pVar69,"mp_hs_integer");
        if (_Var2) {
          pmVar14 = get_val_mpint(in);
          uVar16 = get_uint(in);
          uVar7 = mp_hs_integer(pmVar14,uVar16);
        }
        else {
          _Var2 = ptrlen_eq_string(pVar69,"mp_eq_integer");
          if (_Var2) {
            pmVar14 = get_val_mpint(in);
            uVar16 = get_uint(in);
            uVar7 = mp_eq_integer(pmVar14,uVar16);
          }
          else {
            _Var2 = ptrlen_eq_string(pVar69,"mp_min_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              mp_min_into(pmVar14,pmVar18,pmVar19);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_max_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              mp_max_into(pmVar14,pmVar18,pmVar19);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_min");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar14 = mp_min(pmVar14,pmVar18);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_max");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar14 = mp_max(pmVar14,pmVar18);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_copy_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              mp_copy_into(pmVar14,pmVar18);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_select_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              uVar16 = get_uint(in);
              mp_select_into(pmVar14,pmVar18,pmVar19,(uint)uVar16);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_add_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              mp_add_into(pmVar14,pmVar18,pmVar19);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_sub_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              mp_sub_into(pmVar14,pmVar18,pmVar19);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_mul_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              mp_mul_into(pmVar14,pmVar18,pmVar19);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_add");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar14 = mp_add(pmVar14,pmVar18);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_sub");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar14 = mp_sub(pmVar14,pmVar18);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_mul");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar14 = mp_mul(pmVar14,pmVar18);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_and_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              mp_and_into(pmVar14,pmVar18,pmVar19);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_or_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              mp_or_into(pmVar14,pmVar18,pmVar19);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_xor_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              mp_xor_into(pmVar14,pmVar18,pmVar19);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_bic_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              mp_bic_into(pmVar14,pmVar18,pmVar19);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_copy_integer_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              uVar16 = get_uint(in);
              mp_copy_integer_into(pmVar14,uVar16);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_add_integer_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              uVar16 = get_uint(in);
              mp_add_integer_into(pmVar14,pmVar18,uVar16);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_sub_integer_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              uVar16 = get_uint(in);
              mp_sub_integer_into(pmVar14,pmVar18,uVar16);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_mul_integer_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              uVar16 = get_uint(in);
              mp_mul_integer_into(pmVar14,pmVar18,(uint16_t)uVar16);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_cond_add_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              uVar16 = get_uint(in);
              mp_cond_add_into(pmVar14,pmVar18,pmVar19,(uint)uVar16);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_cond_sub_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              uVar16 = get_uint(in);
              mp_cond_sub_into(pmVar14,pmVar18,pmVar19,(uint)uVar16);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_cond_swap");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              uVar16 = get_uint(in);
              mp_cond_swap(pmVar14,pmVar18,(uint)uVar16);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_cond_clear");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              uVar16 = get_uint(in);
              mp_cond_clear(pmVar14,(uint)uVar16);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_divmod_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar20 = get_opt_val_mpint(in);
              pmVar21 = get_opt_val_mpint(in);
              mp_divmod_into(pmVar14,pmVar18,pmVar20,pmVar21);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_div");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar14 = mp_div(pmVar14,pmVar18);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_mod");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar14 = mp_mod(pmVar14,pmVar18);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_nthroot");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              uVar16 = get_uint(in);
              pmVar20 = get_opt_val_mpint(in);
              pmVar14 = mp_nthroot(pmVar14,(uint)uVar16,pmVar20);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_reduce_mod_2to");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              uVar16 = get_uint(in);
              mp_reduce_mod_2to(pmVar14,uVar16);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_invert_mod_2to");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              uVar16 = get_uint(in);
              pmVar14 = mp_invert_mod_2to(pmVar14,uVar16);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_invert");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar14 = mp_invert(pmVar14,pmVar18);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_gcd_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar20 = get_opt_val_mpint(in);
              pmVar21 = get_opt_val_mpint(in);
              B = get_opt_val_mpint(in);
              mp_gcd_into(pmVar14,pmVar18,pmVar20,pmVar21,B);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_gcd");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar14 = mp_gcd(pmVar14,pmVar18);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_coprime");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              uVar7 = mp_coprime(pmVar14,pmVar18);
              goto LAB_0010b5a6;
            }
            _Var2 = ptrlen_eq_string(pVar69,"modsqrt_new");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pMVar22 = modsqrt_new(pmVar14,pmVar18);
              return_val_modsqrt(out,pMVar22);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_modsqrt");
            if (_Var2) {
              pMVar22 = get_val_modsqrt(in);
              pmVar14 = get_val_mpint(in);
              puVar23 = get_out_uint(in);
              pmVar14 = mp_modsqrt(pMVar22,pmVar14,puVar23);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"monty_new");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pMVar24 = monty_new(pmVar14);
              return_val_monty(out,pMVar24);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"monty_modulus");
            if (_Var2) {
              pMVar24 = get_val_monty(in);
              pmVar14 = monty_modulus_wrapper(pMVar24);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"monty_identity");
            if (_Var2) {
              pMVar24 = get_val_monty(in);
              pmVar14 = monty_identity_wrapper(pMVar24);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"monty_import_into");
            if (_Var2) {
              pMVar24 = get_val_monty(in);
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              monty_import_into(pMVar24,pmVar14,pmVar18);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"monty_import");
            if (_Var2) {
              pMVar24 = get_val_monty(in);
              pmVar14 = get_val_mpint(in);
              pmVar14 = monty_import(pMVar24,pmVar14);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"monty_export_into");
            if (_Var2) {
              pMVar24 = get_val_monty(in);
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              monty_export_into(pMVar24,pmVar14,pmVar18);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"monty_export");
            if (_Var2) {
              pMVar24 = get_val_monty(in);
              pmVar14 = get_val_mpint(in);
              pmVar14 = monty_export(pMVar24,pmVar14);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"monty_mul_into");
            if (_Var2) {
              pMVar24 = get_val_monty(in);
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              monty_mul_into(pMVar24,pmVar14,pmVar18,pmVar19);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"monty_add");
            if (_Var2) {
              pMVar24 = get_val_monty(in);
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar14 = monty_add(pMVar24,pmVar14,pmVar18);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"monty_sub");
            if (_Var2) {
              pMVar24 = get_val_monty(in);
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar14 = monty_sub(pMVar24,pmVar14,pmVar18);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"monty_mul");
            if (_Var2) {
              pMVar24 = get_val_monty(in);
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar14 = monty_mul(pMVar24,pmVar14,pmVar18);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"monty_pow");
            if (_Var2) {
              pMVar24 = get_val_monty(in);
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar14 = monty_pow(pMVar24,pmVar14,pmVar18);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"monty_invert");
            if (_Var2) {
              pMVar24 = get_val_monty(in);
              pmVar14 = get_val_mpint(in);
              pmVar14 = monty_invert(pMVar24,pmVar14);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"monty_modsqrt");
            if (_Var2) {
              pMVar22 = get_val_modsqrt(in);
              pmVar14 = get_val_mpint(in);
              puVar23 = get_out_uint(in);
              pmVar14 = monty_modsqrt(pMVar22,pmVar14,puVar23);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_modpow");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              pmVar14 = mp_modpow(pmVar14,pmVar18,pmVar19);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_modmul");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              pmVar14 = mp_modmul(pmVar14,pmVar18,pmVar19);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_modadd");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              pmVar14 = mp_modadd(pmVar14,pmVar18,pmVar19);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_modsub");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              pmVar14 = mp_modsub(pmVar14,pmVar18,pmVar19);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_lshift_safe_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              uVar16 = get_uint(in);
              mp_lshift_safe_into(pmVar14,pmVar18,uVar16);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_rshift_safe_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              uVar16 = get_uint(in);
              mp_rshift_safe_into(pmVar14,pmVar18,uVar16);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_rshift_safe");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              uVar16 = get_uint(in);
              pmVar14 = mp_rshift_safe(pmVar14,uVar16);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_lshift_fixed_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              uVar16 = get_uint(in);
              mp_lshift_fixed_into(pmVar14,pmVar18,uVar16);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_rshift_fixed_into");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              uVar16 = get_uint(in);
              mp_rshift_fixed_into(pmVar14,pmVar18,uVar16);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_rshift_fixed");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              uVar16 = get_uint(in);
              pmVar14 = mp_rshift_fixed(pmVar14,uVar16);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_random_bits");
            if (_Var2) {
              uVar16 = get_uint(in);
              pmVar14 = mp_random_bits_fn(uVar16,random_read);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"mp_random_in_range");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar14 = mp_random_in_range_fn(pmVar14,pmVar18,random_read);
              goto LAB_0010b11f;
            }
            _Var2 = ptrlen_eq_string(pVar69,"ecc_weierstrass_curve");
            if (_Var2) {
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pmVar19 = get_val_mpint(in);
              pmVar20 = get_opt_val_mpint(in);
              pWVar25 = ecc_weierstrass_curve(pmVar14,pmVar18,pmVar19,pmVar20);
              return_val_wcurve(out,pWVar25);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"ecc_weierstrass_point_new_identity");
            if (_Var2) {
              pWVar25 = get_val_wcurve(in);
              pWVar26 = ecc_weierstrass_point_new_identity(pWVar25);
LAB_0010f663:
              return_val_wpoint(out,pWVar26);
              return;
            }
            _Var2 = ptrlen_eq_string(pVar69,"ecc_weierstrass_point_new");
            if (_Var2) {
              pWVar25 = get_val_wcurve(in);
              pmVar14 = get_val_mpint(in);
              pmVar18 = get_val_mpint(in);
              pWVar26 = ecc_weierstrass_point_new(pWVar25,pmVar14,pmVar18);
              goto LAB_0010f663;
            }
            _Var2 = ptrlen_eq_string(pVar69,"ecc_weierstrass_point_new_from_x");
            if (_Var2) {
              pWVar25 = get_val_wcurve(in);
              pmVar14 = get_val_mpint(in);
              uVar16 = get_uint(in);
              pWVar26 = ecc_weierstrass_point_new_from_x(pWVar25,pmVar14,(uint)uVar16);
              goto LAB_0010f663;
            }
            _Var2 = ptrlen_eq_string(pVar69,"ecc_weierstrass_point_copy");
            if (_Var2) {
              pWVar26 = get_val_wpoint(in);
              pWVar26 = ecc_weierstrass_point_copy(pWVar26);
              goto LAB_0010f663;
            }
            _Var2 = ptrlen_eq_string(pVar69,"ecc_weierstrass_point_valid");
            if (_Var2) {
              pWVar26 = get_val_wpoint(in);
              uVar7 = ecc_weierstrass_point_valid(pWVar26);
            }
            else {
              _Var2 = ptrlen_eq_string(pVar69,"ecc_weierstrass_add_general");
              if (_Var2) {
                pWVar26 = get_val_wpoint(in);
                pWVar27 = get_val_wpoint(in);
                pWVar26 = ecc_weierstrass_add_general(pWVar26,pWVar27);
                goto LAB_0010f663;
              }
              _Var2 = ptrlen_eq_string(pVar69,"ecc_weierstrass_add");
              if (_Var2) {
                pWVar26 = get_val_wpoint(in);
                pWVar27 = get_val_wpoint(in);
                pWVar26 = ecc_weierstrass_add(pWVar26,pWVar27);
                goto LAB_0010f663;
              }
              _Var2 = ptrlen_eq_string(pVar69,"ecc_weierstrass_double");
              if (_Var2) {
                pWVar26 = get_val_wpoint(in);
                pWVar26 = ecc_weierstrass_double(pWVar26);
                goto LAB_0010f663;
              }
              _Var2 = ptrlen_eq_string(pVar69,"ecc_weierstrass_multiply");
              if (_Var2) {
                pWVar26 = get_val_wpoint(in);
                pmVar14 = get_val_mpint(in);
                pWVar26 = ecc_weierstrass_multiply(pWVar26,pmVar14);
                goto LAB_0010f663;
              }
              _Var2 = ptrlen_eq_string(pVar69,"ecc_weierstrass_is_identity");
              if (!_Var2) {
                _Var2 = ptrlen_eq_string(pVar69,"ecc_weierstrass_get_affine");
                if (_Var2) {
                  pWVar26 = get_val_wpoint(in);
                  ppmVar28 = get_out_val_mpint(in);
                  ppmVar29 = get_out_val_mpint(in);
                  ecc_weierstrass_get_affine(pWVar26,ppmVar28,ppmVar29);
                  return;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ecc_montgomery_curve");
                if (_Var2) {
                  pmVar14 = get_val_mpint(in);
                  pmVar18 = get_val_mpint(in);
                  pmVar19 = get_val_mpint(in);
                  pMVar30 = ecc_montgomery_curve(pmVar14,pmVar18,pmVar19);
                  return_val_mcurve(out,pMVar30);
                  return;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ecc_montgomery_point_new");
                if (_Var2) {
                  pVVar11 = get_value(in);
                  if (pVVar11->type != VT_mcurve) {
                    uVar7 = string_length_for_printf((pVVar11->id).len);
                    pvVar37 = (pVVar11->id).ptr;
                    pcVar66 = type_names[pVVar11->type];
                    pcVar65 = "mcurve";
LAB_0010f6a8:
                    fatal_error("id \'%.*s\': expected %s, got %s",(ulong)uVar7,pvVar37,pcVar65,
                                pcVar66);
                  }
                  pMVar30 = (pVVar11->field_2).vu_mcurve;
                  pmVar14 = get_val_mpint(in);
                  pMVar31 = ecc_montgomery_point_new(pMVar30,pmVar14);
LAB_0010cde9:
                  return_val_mpoint(out,pMVar31);
                  return;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ecc_montgomery_point_copy");
                if (_Var2) {
                  pMVar31 = get_val_mpoint(in);
                  pMVar31 = ecc_montgomery_point_copy(pMVar31);
                  goto LAB_0010cde9;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ecc_montgomery_diff_add");
                if (_Var2) {
                  pMVar31 = get_val_mpoint(in);
                  Q = get_val_mpoint(in);
                  PminusQ = get_val_mpoint(in);
                  pMVar31 = ecc_montgomery_diff_add(pMVar31,Q,PminusQ);
                  goto LAB_0010cde9;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ecc_montgomery_double");
                if (_Var2) {
                  pMVar31 = get_val_mpoint(in);
                  pMVar31 = ecc_montgomery_double(pMVar31);
                  goto LAB_0010cde9;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ecc_montgomery_multiply");
                if (_Var2) {
                  pMVar31 = get_val_mpoint(in);
                  pmVar14 = get_val_mpint(in);
                  pMVar31 = ecc_montgomery_multiply(pMVar31,pmVar14);
                  goto LAB_0010cde9;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ecc_montgomery_get_affine");
                if (_Var2) {
                  pMVar31 = get_val_mpoint(in);
                  ppmVar28 = get_out_val_mpint(in);
                  ecc_montgomery_get_affine(pMVar31,ppmVar28);
                  return;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ecc_montgomery_is_identity");
                if (_Var2) {
                  pMVar31 = get_val_mpoint(in);
                  uVar7 = ecc_montgomery_is_identity(pMVar31);
                  _Var2 = uVar7 != 0;
                  goto LAB_0010fa52;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ecc_edwards_curve");
                if (_Var2) {
                  pmVar14 = get_val_mpint(in);
                  pmVar18 = get_val_mpint(in);
                  pmVar19 = get_val_mpint(in);
                  pmVar20 = get_opt_val_mpint(in);
                  pEVar32 = ecc_edwards_curve(pmVar14,pmVar18,pmVar19,pmVar20);
                  return_val_ecurve(out,pEVar32);
                  return;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ecc_edwards_point_new");
                if (_Var2) {
                  pEVar32 = get_val_ecurve(in);
                  pmVar14 = get_val_mpint(in);
                  pmVar18 = get_val_mpint(in);
                  pEVar33 = ecc_edwards_point_new(pEVar32,pmVar14,pmVar18);
LAB_0010f701:
                  return_val_epoint(out,pEVar33);
                  return;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ecc_edwards_point_new_from_y");
                if (_Var2) {
                  pEVar32 = get_val_ecurve(in);
                  pmVar14 = get_val_mpint(in);
                  uVar16 = get_uint(in);
                  pEVar33 = ecc_edwards_point_new_from_y(pEVar32,pmVar14,(uint)uVar16);
                  goto LAB_0010f701;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ecc_edwards_point_copy");
                if (_Var2) {
                  pEVar33 = get_val_epoint(in);
                  pEVar33 = ecc_edwards_point_copy(pEVar33);
                  goto LAB_0010f701;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ecc_edwards_add");
                if (_Var2) {
                  pEVar33 = get_val_epoint(in);
                  pEVar34 = get_val_epoint(in);
                  pEVar33 = ecc_edwards_add(pEVar33,pEVar34);
                  goto LAB_0010f701;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ecc_edwards_multiply");
                if (_Var2) {
                  pEVar33 = get_val_epoint(in);
                  pmVar14 = get_val_mpint(in);
                  pEVar33 = ecc_edwards_multiply(pEVar33,pmVar14);
                  goto LAB_0010f701;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ecc_edwards_eq");
                if (_Var2) {
                  pEVar33 = get_val_epoint(in);
                  pEVar34 = get_val_epoint(in);
                  uVar7 = ecc_edwards_eq(pEVar33,pEVar34);
                  goto LAB_0010b5a6;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ecc_edwards_get_affine");
                if (_Var2) {
                  pEVar33 = get_val_epoint(in);
                  ppmVar28 = get_out_val_mpint(in);
                  ppmVar29 = get_out_val_mpint(in);
                  ecc_edwards_get_affine(pEVar33,ppmVar28,ppmVar29);
                  return;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ssh_hash_new");
                if (_Var2) {
                  psVar35 = get_hashalg(in);
                  psVar36 = (*psVar35->new)(psVar35);
                  if (psVar36 != (ssh_hash *)0x0) {
                    (*psVar36->vt->reset)(psVar36);
                  }
LAB_0010d242:
                  return_opt_val_hash(out,psVar36);
                  return;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ssh_hash_reset");
                if (_Var2) {
                  psVar36 = get_val_hash(in);
                  (*psVar36->vt->reset)(psVar36);
                  return;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ssh_hash_copy");
                if (_Var2) {
                  psVar36 = get_val_hash(in);
                  v = (*psVar36->vt->new)(psVar36->vt);
                  (*v->vt->copyfrom)(v,psVar36);
                  return_val_hash(out,v);
                  return;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ssh_hash_digest");
                if (_Var2) {
                  psVar36 = get_val_hash(in);
                  psVar12 = ssh_hash_digest_wrapper(psVar36);
LAB_0010b019:
                  return_val_string(out,psVar12);
                  return;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ssh_hash_final");
                if (_Var2) {
                  pVVar11 = get_value_hash(in);
                  psVar36 = (pVVar11->field_2).vu_hash;
                  del234(values,pVVar11);
                  safefree(pVVar11);
                  psVar12 = ssh_hash_final_wrapper(psVar36);
                  goto LAB_0010b019;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ssh_hash_update");
                if (_Var2) {
                  psVar36 = get_val_hash(in);
                  pVar69 = get_val_string_ptrlen(in);
                  ssh_hash_update(psVar36,pVar69);
                  return;
                }
                _Var2 = ptrlen_eq_string(pVar69,"blake2b_new_general");
                if (_Var2) {
                  uVar16 = get_uint(in);
                  psVar36 = blake2b_new_general((uint)uVar16);
                  goto LAB_0010d242;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ssh2_mac_new");
                if (_Var2) {
                  pVar69 = get_word(in);
                  pvVar37 = pVar69.ptr;
                  _Var2 = enum_translate_macalg(pVar69,(TD_macalg *)&_args);
                  if (_Var2) {
                    pVar69 = get_word(in);
                    _Var2 = ptrlen_eq_string(pVar69,"NULL");
                    if (_Var2) {
                      psVar12 = (strbuf *)0x0;
                    }
                    else {
                      pVar70.ptr._4_4_ = in_stack_fffffffffffffdfc;
                      pVar70.ptr._0_4_ = in_stack_fffffffffffffdf8;
                      pVar70.len._0_4_ = in_stack_fffffffffffffe00;
                      pVar70.len._4_4_ = in_stack_fffffffffffffe04;
                      pVVar11 = lookup_value(pVar70);
                      unwrap_value_cipher(pVVar11);
                      psVar12 = (pVVar11->field_2).vu_string;
                    }
                    psVar38 = (ssh2_mac *)(**(code **)_args._0_8_)(_args._0_8_,psVar12);
                    return_val_mac(out,psVar38);
                    return;
                  }
                  uVar7 = string_length_for_printf(pVar69.len);
                  pcVar66 = "macalg";
LAB_0010df44:
                  uVar13 = (ulong)uVar7;
                  goto LAB_0010fc93;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ssh2_mac_setkey");
                if (_Var2) {
                  psVar38 = get_val_mac(in);
                  pVar69 = get_val_string_ptrlen(in);
                  (*psVar38->vt->setkey)(psVar38,pVar69);
                  return;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ssh2_mac_start");
                if (_Var2) {
                  psVar38 = get_val_mac(in);
                  (*psVar38->vt->start)(psVar38);
                  return;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ssh2_mac_update");
                if (_Var2) {
                  psVar38 = get_val_mac(in);
                  pVar69 = get_val_string_ptrlen(in);
                  ssh2_mac_update(psVar38,pVar69);
                  return;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ssh2_mac_genresult");
                if (_Var2) {
                  psVar38 = get_val_mac(in);
                  psVar12 = ssh2_mac_genresult_wrapper(psVar38);
                  goto LAB_0010b019;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ssh2_mac_text_name");
                if (_Var2) {
                  psVar38 = get_val_mac(in);
                  pcVar66 = (*psVar38->vt->text_name)(psVar38);
LAB_0010da39:
                  return_val_string_asciz_const(out,pcVar66);
                  return;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ssh_key_new_pub");
                if (_Var2) {
                  psVar39 = get_keyalg(in);
                  pVar69 = get_val_string_ptrlen(in);
                  psVar40 = (*psVar39->new_pub)(psVar39,pVar69);
                  goto LAB_0010eed9;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ssh_key_new_priv");
                if (_Var2) {
                  psVar39 = get_keyalg(in);
                  pVar69 = get_val_string_ptrlen(in);
                  pVar70 = get_val_string_ptrlen(in);
                  psVar40 = (*psVar39->new_priv)(psVar39,pVar69,pVar70);
LAB_0010ef3b:
                  return_opt_val_key(out,psVar40);
                  return;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ssh_key_new_priv_openssh");
                if (_Var2) {
                  psVar39 = get_keyalg(in);
                  pBVar41 = get_val_string_binarysource(in);
                  psVar40 = (*psVar39->new_priv_openssh)(psVar39,pBVar41);
                  goto LAB_0010ef3b;
                }
                _Var2 = ptrlen_eq_string(pVar69,"ssh_key_invalid");
                if (_Var2) {
                  psVar40 = get_val_key(in);
                  uVar16 = get_uint(in);
                  pcVar66 = (*psVar40->vt->invalid)(psVar40,(uint)uVar16);
                  if (pcVar66 != (char *)0x0) goto LAB_0010b70a;
                }
                else {
                  _Var2 = ptrlen_eq_string(pVar69,"ssh_key_sign");
                  if (_Var2) {
                    psVar40 = get_val_key(in);
                    pVar69 = get_val_string_ptrlen(in);
                    uVar16 = get_uint(in);
                    pBVar42 = get_out_val_string_binarysink(in);
                    (*psVar40->vt->sign)(psVar40,pVar69,(uint)uVar16,pBVar42);
                    return;
                  }
                  _Var2 = ptrlen_eq_string(pVar69,"ssh_key_verify");
                  if (_Var2) {
                    psVar40 = get_val_key(in);
                    pVar69 = get_val_string_ptrlen(in);
                    pVar70 = get_val_string_ptrlen(in);
                    _Var2 = (*psVar40->vt->verify)(psVar40,pVar69,pVar70);
                    goto LAB_0010fa52;
                  }
                  _Var2 = ptrlen_eq_string(pVar69,"ssh_key_public_blob");
                  if (_Var2) {
                    psVar43 = (ssh_keyalg *)get_val_key(in);
                    pBVar41 = (BinarySource *)get_out_val_string_binarysink(in);
                    UNRECOVERED_JUMPTABLE = ((ssh_keyalg *)psVar43->new_pub)->public_blob;
LAB_0010df15:
                    (*UNRECOVERED_JUMPTABLE)(psVar43,pBVar41);
                    return;
                  }
                  _Var2 = ptrlen_eq_string(pVar69,"ssh_key_private_blob");
                  if (_Var2) {
                    psVar43 = (ssh_keyalg *)get_val_key(in);
                    pBVar41 = (BinarySource *)get_out_val_string_binarysink(in);
                    UNRECOVERED_JUMPTABLE = ((ssh_keyalg *)psVar43->new_pub)->private_blob;
                    goto LAB_0010df15;
                  }
                  _Var2 = ptrlen_eq_string(pVar69,"ssh_key_openssh_blob");
                  if (_Var2) {
                    psVar43 = (ssh_keyalg *)get_val_key(in);
                    pBVar41 = (BinarySource *)get_out_val_string_binarysink(in);
                    UNRECOVERED_JUMPTABLE = ((ssh_keyalg *)psVar43->new_pub)->openssh_blob;
                    goto LAB_0010df15;
                  }
                  _Var2 = ptrlen_eq_string(pVar69,"ssh_key_cache_str");
                  if (_Var2) {
                    psVar40 = get_val_key(in);
                    pcVar66 = (*psVar40->vt->cache_str)(psVar40);
                    goto LAB_0010b70a;
                  }
                  _Var2 = ptrlen_eq_string(pVar69,"ssh_key_components");
                  if (_Var2) {
                    psVar40 = get_val_key(in);
                    pkVar44 = (*psVar40->vt->components)(psVar40);
                    return_val_keycomponents(out,pkVar44);
                    return;
                  }
                  _Var2 = ptrlen_eq_string(pVar69,"ssh_key_public_bits");
                  if (_Var2) {
                    psVar39 = get_keyalg(in);
                    pVar69 = get_val_string_ptrlen(in);
                    iVar8 = (*psVar39->pubkey_bits)(psVar39,pVar69);
LAB_0010e417:
                    sVar15 = (size_t)iVar8;
                    goto LAB_0010b5ab;
                  }
                  _Var2 = ptrlen_eq_string(pVar69,"ssh_key_base_key");
                  if (_Var2) {
                    psVar40 = get_val_key(in);
                    psVar40 = ssh_key_base_key_wrapper(psVar40);
                    goto LAB_0010eed9;
                  }
                  _Var2 = ptrlen_eq_string(pVar69,"ssh_key_ca_public_blob");
                  if (_Var2) {
                    psVar40 = get_val_key(in);
                    pBVar42 = get_out_val_string_binarysink(in);
                    ssh_key_ca_public_blob_wrapper(psVar40,pBVar42);
                    return;
                  }
                  _Var2 = ptrlen_eq_string(pVar69,"ssh_key_cert_id_string");
                  if (_Var2) {
                    psVar40 = get_val_key(in);
                    pBVar42 = get_out_val_string_binarysink(in);
                    ssh_key_cert_id_string_wrapper(psVar40,pBVar42);
                    return;
                  }
                  _Var2 = ptrlen_eq_string(pVar69,"ssh_key_check_cert");
                  if (_Var2) {
                    psVar40 = get_val_key(in);
                    _Var2 = get_boolean(in);
                    pVar70 = get_val_string_ptrlen(in);
                    local_160 = pVar70.len;
                    local_168 = get_uint(in);
                    pVar69 = get_val_string_ptrlen(in);
                    local_170 = get_out_val_string_binarysink(in);
                    if (psVar40->vt->is_certificate != false) {
                      _local_180 = (ca_options)0x10101;
                      _args.response = (TD_out_val_string_binarysink)pVar69.len;
                      while (_args._0_16_ = pVar69,
                            bVar67 = _args.response != (TD_out_val_string_binarysink)0x0, bVar67) {
                        pVar69 = ptrlen_get_word((ptrlen *)&_args,",");
                        __n = pVar69.len;
                        pvVar37 = pVar69.ptr;
                        pvVar45 = memchr(pvVar37,0x3d,__n);
                        pcVar66 = (char *)((long)pvVar45 + 1);
                        sVar15 = ~((long)pvVar45 - (long)pvVar37) + __n;
                        uVar13 = (long)pvVar45 - (long)pvVar37;
                        if (pvVar45 == (void *)0x0) {
                          pcVar66 = "";
                          sVar15 = 0;
                          uVar13 = __n;
                        }
                        pVar71.len = uVar13;
                        pVar71.ptr = pvVar37;
                        _Var6 = ptrlen_eq_string(pVar71,"permit_rsa_sha1");
                        if (_Var6) {
                          pl.len = sVar15;
                          pl.ptr = pcVar66;
                          _Var6 = ptrlen_eq_string(pl,"true");
                          local_180[0] = _Var6;
                        }
                        pl_00.len = uVar13;
                        pl_00.ptr = pvVar37;
                        _Var6 = ptrlen_eq_string(pl_00,"permit_rsa_sha256");
                        if (_Var6) {
                          pl_01.len = sVar15;
                          pl_01.ptr = pcVar66;
                          _Var6 = ptrlen_eq_string(pl_01,"true");
                          local_180[1] = _Var6;
                        }
                        pl_02.len = uVar13;
                        pl_02.ptr = pvVar37;
                        _Var6 = ptrlen_eq_string(pl_02,"permit_rsa_sha512");
                        if (_Var6) {
                          pl_03.len = sVar15;
                          pl_03.ptr = pcVar66;
                          _Var6 = ptrlen_eq_string(pl_03,"true");
                          _Stack_17e = _Var6;
                        }
                        pVar69 = (ptrlen)_args._0_16_;
                      }
                      pVar68.len = local_160;
                      pVar68.ptr = pVar70.ptr;
                      _Var2 = (*psVar40->vt->check_cert)
                                        (psVar40,_Var2,pVar68,local_168,(ca_options *)local_180,
                                         local_170);
                      return_boolean(out,_Var2);
                      return;
                    }
                    _args._0_16_ = pVar69;
                    fatal_error("ssh_key_cert_id_string: needs a certificate");
                  }
                  _Var2 = ptrlen_eq_string(pVar69,"key_components_count");
                  if (_Var2) {
                    pkVar44 = get_val_keycomponents(in);
                    sVar15 = pkVar44->ncomponents;
                    goto LAB_0010b5ab;
                  }
                  _Var2 = ptrlen_eq_string(pVar69,"key_components_nth_name");
                  if (!_Var2) {
                    _Var2 = ptrlen_eq_string(pVar69,"key_components_nth_str");
                    if (_Var2) {
                      pkVar44 = get_val_keycomponents(in);
                      uVar16 = get_uint(in);
                      psVar12 = key_components_nth_str(pkVar44,uVar16);
LAB_0010e608:
                      return_opt_val_string(out,psVar12);
                      return;
                    }
                    _Var2 = ptrlen_eq_string(pVar69,"key_components_nth_mp");
                    if (_Var2) {
                      pkVar44 = get_val_keycomponents(in);
                      uVar16 = get_uint(in);
                      pmVar14 = key_components_nth_mp(pkVar44,uVar16);
LAB_0010f06d:
                      return_opt_val_mpint(out,pmVar14);
                      return;
                    }
                    _Var2 = ptrlen_eq_string(pVar69,"ssh_cipher_new");
                    if (_Var2) {
                      pVar69 = get_word(in);
                      pvVar37 = pVar69.ptr;
                      _Var2 = enum_translate_cipheralg(pVar69,(TD_cipheralg *)&_args);
                      if (_Var2) {
                        psVar46 = (ssh_cipher *)(**(code **)_args._0_8_)();
                        if (psVar46 != (ssh_cipher *)0x0) {
                          return_val_cipher(out,psVar46);
                          return;
                        }
                        BinarySink_put_fmt(out->binarysink_,"NULL\n");
                        return;
                      }
                      uVar7 = string_length_for_printf(pVar69.len);
                      pcVar66 = "cipheralg";
                    }
                    else {
                      _Var2 = ptrlen_eq_string(pVar69,"ssh_cipher_setiv");
                      if (_Var2) {
                        psVar46 = get_val_cipher(in);
                        pVar69 = get_val_string_ptrlen(in);
                        ssh_cipher_setiv_wrapper(psVar46,pVar69);
                        return;
                      }
                      _Var2 = ptrlen_eq_string(pVar69,"ssh_cipher_setkey");
                      if (_Var2) {
                        psVar46 = get_val_cipher(in);
                        pVar69 = get_val_string_ptrlen(in);
                        ssh_cipher_setkey_wrapper(psVar46,pVar69);
                        return;
                      }
                      _Var2 = ptrlen_eq_string(pVar69,"ssh_cipher_encrypt");
                      if (_Var2) {
                        psVar46 = get_val_cipher(in);
                        pVar69 = get_val_string_ptrlen(in);
                        psVar12 = ssh_cipher_encrypt_wrapper(psVar46,pVar69);
                        goto LAB_0010b019;
                      }
                      _Var2 = ptrlen_eq_string(pVar69,"ssh_cipher_decrypt");
                      if (_Var2) {
                        psVar46 = get_val_cipher(in);
                        pVar69 = get_val_string_ptrlen(in);
                        psVar12 = ssh_cipher_decrypt_wrapper(psVar46,pVar69);
                        goto LAB_0010b019;
                      }
                      _Var2 = ptrlen_eq_string(pVar69,"ssh_cipher_encrypt_length");
                      if (_Var2) {
                        psVar46 = get_val_cipher(in);
                        pVar69 = get_val_string_ptrlen(in);
                        uVar16 = get_uint(in);
                        psVar12 = ssh_cipher_encrypt_length_wrapper(psVar46,pVar69,uVar16);
                        goto LAB_0010b019;
                      }
                      _Var2 = ptrlen_eq_string(pVar69,"ssh_cipher_decrypt_length");
                      if (_Var2) {
                        psVar46 = get_val_cipher(in);
                        pVar69 = get_val_string_ptrlen(in);
                        uVar16 = get_uint(in);
                        psVar12 = ssh_cipher_decrypt_length_wrapper(psVar46,pVar69,uVar16);
                        goto LAB_0010b019;
                      }
                      _Var2 = ptrlen_eq_string(pVar69,"dh_setup_group");
                      if (!_Var2) {
                        _Var2 = ptrlen_eq_string(pVar69,"dh_setup_gex");
                        if (_Var2) {
                          pmVar14 = get_val_mpint(in);
                          pmVar18 = get_val_mpint(in);
                          pdVar47 = dh_setup_gex(pmVar14,pmVar18);
                          return_val_dh(out,pdVar47);
                          return;
                        }
                        _Var2 = ptrlen_eq_string(pVar69,"dh_modulus_bit_size");
                        if (_Var2) {
                          pdVar47 = get_val_dh(in);
                          iVar8 = dh_modulus_bit_size(pdVar47);
                        }
                        else {
                          _Var2 = ptrlen_eq_string(pVar69,"dh_create_e");
                          if (_Var2) {
                            pdVar47 = get_val_dh(in);
                            pmVar14 = dh_create_e(pdVar47);
                            goto LAB_0010b11f;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"dh_validate_f");
                          if (_Var2) {
                            pdVar47 = get_val_dh(in);
                            pmVar14 = get_val_mpint(in);
                            _Var2 = dh_validate_f_wrapper(pdVar47,pmVar14);
                            goto LAB_0010fa52;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"dh_find_K");
                          if (_Var2) {
                            pdVar47 = get_val_dh(in);
                            pmVar14 = get_val_mpint(in);
                            pmVar14 = dh_find_K(pdVar47,pmVar14);
                            goto LAB_0010b11f;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ecdh_key_new");
                          if (_Var2) {
                            pVar69 = get_word(in);
                            pvVar37 = pVar69.ptr;
                            _Var2 = enum_translate_ecdh_alg(pVar69,(TD_ecdh_alg *)&_args);
                            if (_Var2) {
                              _Var2 = get_boolean(in);
                              peVar48 = (ecdh_key *)
                                        (*(code *)**(undefined8 **)(_args._0_8_ + 0x20))
                                                  (_args._0_8_,_Var2);
                              return_val_ecdh(out,peVar48);
                              return;
                            }
                            uVar7 = string_length_for_printf(pVar69.len);
                            pcVar66 = "ecdh_alg";
                            goto LAB_0010df44;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ecdh_key_getpublic");
                          if (_Var2) {
                            psVar43 = (ssh_keyalg *)get_val_ecdh(in);
                            pBVar41 = (BinarySource *)get_out_val_string_binarysink(in);
                            UNRECOVERED_JUMPTABLE =
                                 (_func_void_ssh_key_ptr_BinarySink_ptr *)
                                 ((ecdh_keyalg *)psVar43->new_pub)->getpublic;
                            goto LAB_0010df15;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ecdh_key_getkey");
                          if (_Var2) {
                            peVar48 = get_val_ecdh(in);
                            pVar69 = get_val_string_ptrlen(in);
                            psVar12 = ecdh_key_getkey_wrapper(peVar48,pVar69);
                            goto LAB_0010e608;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ntru_ring_multiply");
                          if (_Var2) {
                            piVar49 = get_int16_list(in);
                            piVar50 = get_int16_list(in);
                            uVar16 = get_uint(in);
                            uVar17 = get_uint(in);
                            piVar49 = ntru_ring_multiply_wrapper
                                                (piVar49,piVar50,(uint)uVar16,(uint)uVar17);
                            goto LAB_0010e3a7;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ntru_ring_invert");
                          if (_Var2) {
                            piVar49 = get_int16_list(in);
                            uVar16 = get_uint(in);
                            uVar17 = get_uint(in);
                            piVar49 = ntru_ring_invert_wrapper(piVar49,(uint)uVar16,(uint)uVar17);
LAB_0010e246:
                            return_opt_int16_list(out,piVar49);
                            return;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ntru_mod3");
                          if (_Var2) {
                            piVar49 = get_int16_list(in);
                            uVar16 = get_uint(in);
                            uVar17 = get_uint(in);
                            piVar49 = ntru_mod3_wrapper(piVar49,(uint)uVar16,(uint)uVar17);
LAB_0010e3a7:
                            return_int16_list(out,piVar49);
                            return;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ntru_round3");
                          if (_Var2) {
                            piVar49 = get_int16_list(in);
                            uVar16 = get_uint(in);
                            uVar17 = get_uint(in);
                            piVar49 = ntru_round3_wrapper(piVar49,(uint)uVar16,(uint)uVar17);
                            goto LAB_0010e3a7;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ntru_bias");
                          if (_Var2) {
                            piVar49 = get_int16_list(in);
                            uVar16 = get_uint(in);
                            uVar17 = get_uint(in);
                            uVar51 = get_uint(in);
                            piVar49 = ntru_bias_wrapper(piVar49,(uint)uVar16,(uint)uVar17,
                                                        (uint)uVar51);
                            goto LAB_0010e3a7;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ntru_scale");
                          if (_Var2) {
                            piVar49 = get_int16_list(in);
                            uVar16 = get_uint(in);
                            uVar17 = get_uint(in);
                            uVar51 = get_uint(in);
                            piVar49 = ntru_scale_wrapper(piVar49,(uint)uVar16,(uint)uVar17,
                                                         (uint)uVar51);
                            goto LAB_0010e3a7;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ntru_encode_schedule");
                          if (_Var2) {
                            piVar49 = get_int16_list(in);
                            pNVar52 = ntru_encode_schedule_wrapper(piVar49);
                            return_val_ntruencodeschedule(out,pNVar52);
                            return;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ntru_encode_schedule_length");
                          if (_Var2) {
                            pNVar52 = get_val_ntruencodeschedule(in);
                            sVar15 = ntru_encode_schedule_length(pNVar52);
                            goto LAB_0010b5ab;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ntru_encode");
                          if (_Var2) {
                            pNVar52 = get_val_ntruencodeschedule(in);
                            piVar49 = get_int16_list(in);
                            pBVar42 = get_out_val_string_binarysink(in);
                            ntru_encode_wrapper(pNVar52,piVar49,pBVar42);
                            return;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ntru_decode");
                          if (_Var2) {
                            pNVar52 = get_val_ntruencodeschedule(in);
                            pVar69 = get_val_string_ptrlen(in);
                            piVar49 = ntru_decode_wrapper(pNVar52,pVar69);
                            goto LAB_0010e246;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ntru_gen_short");
                          if (_Var2) {
                            uVar16 = get_uint(in);
                            uVar17 = get_uint(in);
                            piVar49 = ntru_gen_short_wrapper((uint)uVar16,(uint)uVar17);
                            goto LAB_0010e3a7;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ntru_keygen");
                          if (_Var2) {
                            uVar16 = get_uint(in);
                            uVar17 = get_uint(in);
                            uVar51 = get_uint(in);
                            pNVar53 = ntru_keygen((uint)uVar16,(uint)uVar17,(uint)uVar51);
                            return_val_ntrukeypair(out,pNVar53);
                            return;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ntru_pubkey");
                          if (_Var2) {
                            pNVar53 = get_val_ntrukeypair(in);
                            piVar49 = ntru_pubkey_wrapper(pNVar53);
                            goto LAB_0010e3a7;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ntru_encrypt");
                          if (_Var2) {
                            piVar49 = get_int16_list(in);
                            piVar50 = get_int16_list(in);
                            uVar16 = get_uint(in);
                            uVar17 = get_uint(in);
                            piVar49 = ntru_encrypt_wrapper
                                                (piVar49,piVar50,(uint)uVar16,(uint)uVar17);
                            goto LAB_0010e3a7;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ntru_decrypt");
                          if (_Var2) {
                            piVar49 = get_int16_list(in);
                            pNVar53 = get_val_ntrukeypair(in);
                            piVar49 = ntru_decrypt_wrapper(piVar49,pNVar53);
                            goto LAB_0010e3a7;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ssh_rsakex_newkey");
                          if (_Var2) {
                            pVar69 = get_val_string_ptrlen(in);
                            pRVar54 = ssh_rsakex_newkey(pVar69);
LAB_0010e4da:
                            return_val_rsakex(out,pRVar54);
                            return;
                          }
                          _Var2 = ptrlen_eq_string(pVar69,"ssh_rsakex_klen");
                          if (!_Var2) {
                            _Var2 = ptrlen_eq_string(pVar69,"ssh_rsakex_encrypt");
                            if (_Var2) {
                              pRVar54 = get_val_rsakex(in);
                              psVar35 = get_hashalg(in);
                              pVar69 = get_val_string_ptrlen(in);
                              psVar12 = ssh_rsakex_encrypt(pRVar54,psVar35,pVar69);
                              goto LAB_0010b019;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"ssh_rsakex_decrypt");
                            if (_Var2) {
                              pRVar54 = get_val_rsakex(in);
                              psVar35 = get_hashalg(in);
                              pVar69 = get_val_string_ptrlen(in);
                              pmVar14 = ssh_rsakex_decrypt(pRVar54,psVar35,pVar69);
                              goto LAB_0010f06d;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"get_rsa_ssh1_priv_agent");
                            if (_Var2) {
                              pBVar41 = get_val_string_binarysource(in);
                              pRVar54 = BinarySource_get_rsa_ssh1_priv_agent(pBVar41->binarysource_)
                              ;
                              goto LAB_0010e4da;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"rsa_new");
                            if (_Var2) {
                              pRVar54 = (RSAKey *)safemalloc(1,0x48,0);
                              pRVar54->bits = 0;
                              pRVar54->bytes = 0;
                              pRVar54->modulus = (mp_int *)0x0;
                              pRVar54->exponent = (mp_int *)0x0;
                              pRVar54->private_exponent = (mp_int *)0x0;
                              (pRVar54->sshk).vt = (ssh_keyalg *)0x0;
                              pRVar54->p = (mp_int *)0x0;
                              pRVar54->q = (mp_int *)0x0;
                              pRVar54->iqmp = (mp_int *)0x0;
                              pRVar54->comment = (char *)0x0;
LAB_0010ef99:
                              return_val_rsa(out,pRVar54);
                              return;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"get_rsa_ssh1_pub");
                            if (_Var2) {
                              pBVar41 = get_val_string_binarysource(in);
                              pRVar54 = get_val_rsa(in);
                              TVar9 = get_rsaorder(in);
                              BinarySource_get_rsa_ssh1_pub(pBVar41->binarysource_,pRVar54,TVar9);
                              return;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"get_rsa_ssh1_priv");
                            if (_Var2) {
                              pBVar41 = get_val_string_binarysource(in);
                              pRVar54 = get_val_rsa(in);
                              BinarySource_get_rsa_ssh1_priv(pBVar41->binarysource_,pRVar54);
                              return;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"rsa_ssh1_encrypt");
                            if (_Var2) {
                              pVar69 = get_val_string_ptrlen(in);
                              pRVar54 = get_val_rsa(in);
                              psVar12 = rsa_ssh1_encrypt_wrapper(pVar69,pRVar54);
                              goto LAB_0010e608;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"rsa_ssh1_decrypt");
                            if (_Var2) {
                              pmVar14 = get_val_mpint(in);
                              pRVar54 = get_val_rsa(in);
                              pmVar14 = rsa_ssh1_decrypt(pmVar14,pRVar54);
                              goto LAB_0010b11f;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"rsa_ssh1_decrypt_pkcs1");
                            if (_Var2) {
                              pmVar14 = get_val_mpint(in);
                              pRVar54 = get_val_rsa(in);
                              psVar12 = rsa_ssh1_decrypt_pkcs1_wrapper(pmVar14,pRVar54);
                              goto LAB_0010b019;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"rsastr_fmt");
                            if (_Var2) {
                              pRVar54 = get_val_rsa(in);
                              pcVar66 = rsastr_fmt(pRVar54);
                              goto LAB_0010b70a;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"rsa_ssh1_fingerprint");
                            if (_Var2) {
                              pRVar54 = get_val_rsa(in);
                              pcVar66 = rsa_ssh1_fingerprint(pRVar54);
                              goto LAB_0010b70a;
                            }
                            pBVar58 = pBVar41;
                            _Var2 = ptrlen_eq_string(pVar69,"rsa_ssh1_public_blob");
                            if (_Var2) {
                              pBVar42 = get_out_val_string_binarysink(pBVar58);
                              pRVar54 = get_val_rsa(in);
                              TVar9 = get_rsaorder(in);
                              rsa_ssh1_public_blob(pBVar42,pRVar54,TVar9);
                              return;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"rsa_ssh1_public_blob_len");
                            if (_Var2) {
                              pVar69 = get_val_string_ptrlen(in);
                              iVar8 = rsa_ssh1_public_blob_len(pVar69);
                              goto LAB_0010eac7;
                            }
                            pBVar58 = pBVar41;
                            _Var2 = ptrlen_eq_string(pVar69,"rsa_ssh1_private_blob_agent");
                            if (_Var2) {
                              pBVar42 = get_out_val_string_binarysink(pBVar58);
                              pRVar54 = get_val_rsa(in);
                              rsa_ssh1_private_blob_agent(pBVar42,pRVar54);
                              return;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"prng_new");
                            if (_Var2) {
                              psVar35 = get_hashalg(in);
                              ppVar55 = prng_new(psVar35);
                              return_val_prng(out,ppVar55);
                              return;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"prng_seed_begin");
                            if (_Var2) {
                              ppVar55 = get_val_prng(in);
                              prng_seed_begin(ppVar55);
                              return;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"prng_seed_update");
                            if (_Var2) {
                              ppVar55 = get_val_prng(in);
                              pVar69 = get_val_string_ptrlen(in);
                              pBVar42 = ppVar55->binarysink_;
                              goto LAB_0010b35d;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"prng_seed_finish");
                            if (_Var2) {
                              ppVar55 = get_val_prng(in);
LAB_0010fd29:
                              prng_seed_finish(ppVar55);
                              return;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"prng_read");
                            if (_Var2) {
                              ppVar55 = get_val_prng(in);
                              uVar16 = get_uint(in);
                              psVar12 = prng_read_wrapper(ppVar55,uVar16);
                              goto LAB_0010b019;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"prng_add_entropy");
                            if (_Var2) {
                              ppVar55 = get_val_prng(in);
                              uVar16 = get_uint(in);
                              pVar69 = get_val_string_ptrlen(in);
                              prng_add_entropy(ppVar55,(uint)uVar16,pVar69);
                              return;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"ppk_encrypted_s");
                            if (_Var2) {
                              pBVar41 = get_val_string_binarysource(in);
                              ppcVar56 = get_out_opt_val_string_asciz(in);
                              _Var2 = ppk_encrypted_s(pBVar41,ppcVar56);
LAB_0010fa52:
                              return_boolean(out,_Var2);
                              return;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"rsa1_encrypted_s");
                            if (_Var2) {
                              pBVar41 = get_val_string_binarysource(in);
                              ppcVar56 = get_out_opt_val_string_asciz(in);
                              _Var2 = rsa1_encrypted_s(pBVar41,ppcVar56);
                              goto LAB_0010fa52;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"ppk_loadpub_s");
                            if (_Var2) {
                              pBVar41 = get_val_string_binarysource(in);
                              ppcVar56 = get_out_opt_val_string_asciz(in);
                              pBVar42 = get_out_val_string_binarysink(in);
                              ppcVar57 = get_out_opt_val_string_asciz(in);
                              errorstr = get_out_opt_val_string_asciz_const(in);
                              _Var2 = ppk_loadpub_s(pBVar41,ppcVar56,pBVar42,ppcVar57,errorstr);
                              goto LAB_0010fa52;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"rsa1_loadpub_s");
                            if (_Var2) {
                              pBVar41 = get_val_string_binarysource(in);
                              pBVar42 = get_out_val_string_binarysink(in);
                              ppcVar56 = get_out_opt_val_string_asciz(in);
                              ppcVar57 = get_out_opt_val_string_asciz_const(in);
                              iVar8 = rsa1_loadpub_s(pBVar41,pBVar42,ppcVar56,ppcVar57);
LAB_0010eac7:
                              return_int(out,(long)iVar8);
                              return;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"ppk_load_s");
                            if (_Var2) {
                              pBVar41 = in;
                              pBVar58 = get_val_string_binarysource(in);
                              ppcVar56 = get_out_opt_val_string_asciz(pBVar41);
                              pcVar66 = get_opt_val_string_asciz(in);
                              ppcVar57 = get_out_opt_val_string_asciz_const(in);
                              psVar40 = ppk_load_s_wrapper(pBVar58,ppcVar56,pcVar66,ppcVar57);
                              goto LAB_0010ef3b;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"rsa1_load_s");
                            if (_Var2) {
                              pBVar58 = get_val_string_binarysource(in);
                              pBVar41 = in;
                              pRVar54 = get_val_rsa(in);
                              ppcVar56 = get_out_opt_val_string_asciz(pBVar41);
                              pcVar66 = get_opt_val_string_asciz(in);
                              ppcVar57 = get_out_opt_val_string_asciz_const(in);
                              iVar8 = rsa1_load_s_wrapper(pBVar58,pRVar54,ppcVar56,pcVar66,ppcVar57)
                              ;
                              goto LAB_0010eac7;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"ppk_save_sb");
                            if (_Var2) {
                              psVar40 = get_val_key(in);
                              pcVar66 = get_opt_val_string_asciz(in);
                              pcVar65 = get_opt_val_string_asciz(in);
                              uVar16 = get_uint(in);
                              TVar10 = get_argon2flavour(in);
                              uVar17 = get_uint(in);
                              uVar51 = get_uint(in);
                              uVar59 = get_uint(in);
                              psVar12 = ppk_save_sb_wrapper(psVar40,pcVar66,pcVar65,(uint)uVar16,
                                                            TVar10,(uint32_t)uVar17,(uint32_t)uVar51
                                                            ,(uint32_t)uVar59);
                              goto LAB_0010b019;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"rsa1_save_sb");
                            if (_Var2) {
                              pRVar54 = get_val_rsa(in);
                              pcVar66 = get_opt_val_string_asciz(in);
                              pcVar65 = get_opt_val_string_asciz(in);
                              psVar12 = rsa1_save_sb_wrapper(pRVar54,pcVar66,pcVar65);
                              goto LAB_0010b019;
                            }
                            _Var2 = ptrlen_eq_string(pVar69,"ssh2_fingerprint_blob");
                            if (_Var2) {
                              pVar69 = get_val_string_ptrlen(in);
                              pVar70 = get_word(in);
                              pvVar37 = pVar70.ptr;
                              _Var2 = enum_translate_fptype(pVar70,(TD_fptype *)&_args);
                              if (_Var2) {
                                pcVar66 = ssh2_fingerprint_blob(pVar69,_args._predummy_response);
                                return_val_string_asciz(out,pcVar66);
                                return;
                              }
                              uVar7 = string_length_for_printf(pVar70.len);
                              pcVar66 = "fptype";
                            }
                            else {
                              _Var2 = ptrlen_eq_string(pVar69,"argon2");
                              if (_Var2) {
                                TVar10 = get_argon2flavour(in);
                                uVar16 = get_uint(in);
                                uVar17 = get_uint(in);
                                local_160 = get_uint(in);
                                local_168 = get_uint(in);
                                pVar69 = get_val_string_ptrlen(in);
                                local_158 = pVar69.len;
                                local_170 = (BinarySink *)pVar69.ptr;
                                pVar69 = get_val_string_ptrlen(in);
                                pVar70 = get_val_string_ptrlen(in);
                                _args._0_16_ = get_val_string_ptrlen(in);
                                local_150 = local_170;
                                sStack_148 = local_158;
                                _local_180 = pVar70;
                                local_140 = pVar69;
                                psVar12 = strbuf_new();
                                P.len._0_4_ = (int)sStack_148;
                                P.ptr = local_150;
                                P.len._4_4_ = (int)(sStack_148 >> 0x20);
                                argon2(TVar10,(uint32_t)uVar16,(uint32_t)uVar17,(uint32_t)local_160,
                                       (uint32_t)local_168,P,local_140,_local_180,
                                       (ptrlen)_args._0_16_,psVar12);
                                goto LAB_0010b019;
                              }
                              _Var2 = ptrlen_eq_string(pVar69,"argon2_long_hash");
                              if (_Var2) {
                                uVar16 = get_uint(in);
                                pVar69 = get_val_string_ptrlen(in);
                                psVar12 = argon2_long_hash((uint)uVar16,pVar69);
                                goto LAB_0010b019;
                              }
                              _Var2 = ptrlen_eq_string(pVar69,"openssh_bcrypt");
                              if (_Var2) {
                                pVar69 = get_val_string_ptrlen(in);
                                pVar70 = get_val_string_ptrlen(in);
                                uVar16 = get_uint(in);
                                uVar17 = get_uint(in);
                                psVar12 = openssh_bcrypt_wrapper
                                                    (pVar69,pVar70,(uint)uVar16,(uint)uVar17);
                                goto LAB_0010b019;
                              }
                              _Var2 = ptrlen_eq_string(pVar69,"rsa_generate");
                              if (_Var2) {
                                uVar16 = get_uint(in);
                                _Var2 = get_boolean(in);
                                pPVar60 = get_val_pgc(in);
                                pRVar54 = rsa1_generate((int)uVar16,_Var2,pPVar60);
                                psVar40 = &pRVar54->sshk;
LAB_0010eed9:
                                return_val_key(out,psVar40);
                                return;
                              }
                              _Var2 = ptrlen_eq_string(pVar69,"dsa_generate");
                              if (_Var2) {
                                uVar16 = get_uint(in);
                                pPVar60 = get_val_pgc(in);
                                psVar40 = dsa_generate_wrapper((int)uVar16,pPVar60);
                                goto LAB_0010eed9;
                              }
                              _Var2 = ptrlen_eq_string(pVar69,"ecdsa_generate");
                              if (_Var2) {
                                uVar16 = get_uint(in);
                                psVar40 = ecdsa_generate_wrapper((int)uVar16);
                                goto LAB_0010ef3b;
                              }
                              _Var2 = ptrlen_eq_string(pVar69,"eddsa_generate");
                              if (_Var2) {
                                uVar16 = get_uint(in);
                                psVar40 = eddsa_generate_wrapper((int)uVar16);
                                goto LAB_0010ef3b;
                              }
                              _Var2 = ptrlen_eq_string(pVar69,"rsa1_generate");
                              if (_Var2) {
                                uVar16 = get_uint(in);
                                _Var2 = get_boolean(in);
                                pPVar60 = get_val_pgc(in);
                                pRVar54 = rsa1_generate((int)uVar16,_Var2,pPVar60);
                                goto LAB_0010ef99;
                              }
                              _Var2 = ptrlen_eq_string(pVar69,"primegen_new_context");
                              if (!_Var2) {
                                _Var2 = ptrlen_eq_string(pVar69,"primegen_generate");
                                if (_Var2) {
                                  pPVar60 = get_val_pgc(in);
                                  pVVar11 = get_value_pcs(in);
                                  pPVar61 = (pVVar11->field_2).vu_pcs;
                                  del234(values,pVVar11);
                                  safefree(pVVar11);
                                  pmVar14 = (*pPVar60->vt->generate)(pPVar60,pPVar61,&null_progress)
                                  ;
                                  goto LAB_0010f06d;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"primegen_mpu_certificate");
                                if (_Var2) {
                                  pPVar60 = get_val_pgc(in);
                                  pmVar14 = get_val_mpint(in);
                                  psVar12 = (*pPVar60->vt->mpu_certificate)(pPVar60,pmVar14);
                                  goto LAB_0010b019;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"pcs_new");
                                if (_Var2) {
                                  uVar16 = get_uint(in);
                                  pPVar61 = pcs_new((uint)uVar16);
LAB_0010f14b:
                                  return_val_pcs(out,pPVar61);
                                  return;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"pcs_new_with_firstbits");
                                if (_Var2) {
                                  uVar16 = get_uint(in);
                                  uVar17 = get_uint(in);
                                  uVar51 = get_uint(in);
                                  pPVar61 = pcs_new_with_firstbits
                                                      ((uint)uVar16,(uint)uVar17,(uint)uVar51);
                                  goto LAB_0010f14b;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"pcs_require_residue");
                                if (_Var2) {
                                  pPVar61 = get_val_pcs(in);
                                  pmVar14 = get_val_mpint(in);
                                  pmVar18 = get_val_mpint(in);
                                  pcs_require_residue(pPVar61,pmVar14,pmVar18);
                                  return;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"pcs_require_residue_1");
                                if (_Var2) {
                                  pPVar61 = get_val_pcs(in);
                                  pmVar14 = get_val_mpint(in);
                                  pcs_require_residue_1(pPVar61,pmVar14);
                                  return;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"pcs_require_residue_1_mod_prime");
                                if (_Var2) {
                                  pPVar61 = get_val_pcs(in);
                                  pmVar14 = get_val_mpint(in);
                                  pcs_require_residue_1_mod_prime(pPVar61,pmVar14);
                                  return;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"pcs_avoid_residue_small");
                                if (_Var2) {
                                  pPVar61 = get_val_pcs(in);
                                  uVar16 = get_uint(in);
                                  uVar17 = get_uint(in);
                                  pcs_avoid_residue_small(pPVar61,(uint)uVar16,(uint)uVar17);
                                  return;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"pcs_try_sophie_germain");
                                if (_Var2) {
                                  pPVar61 = get_val_pcs(in);
                                  pcs_try_sophie_germain(pPVar61);
                                  return;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"pcs_set_oneshot");
                                if (_Var2) {
                                  pPVar61 = get_val_pcs(in);
                                  pcs_set_oneshot(pPVar61);
                                  return;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"pcs_ready");
                                if (_Var2) {
                                  pPVar61 = get_val_pcs(in);
                                  pcs_ready(pPVar61);
                                  return;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"pcs_inspect");
                                if (_Var2) {
                                  pPVar61 = get_val_pcs(in);
                                  ppmVar28 = get_out_val_mpint(in);
                                  ppmVar29 = get_out_val_mpint(in);
                                  addend_out = get_out_val_mpint(in);
                                  pcs_inspect(pPVar61,ppmVar28,ppmVar29,addend_out);
                                  return;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"pcs_generate");
                                if (_Var2) {
                                  pPVar61 = get_val_pcs(in);
                                  pmVar14 = pcs_generate(pPVar61);
                                  goto LAB_0010b11f;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"pockle_new");
                                if (_Var2) {
                                  pPVar62 = pockle_new();
                                  return_val_pockle(out,pPVar62);
                                  return;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"pockle_mark");
                                if (_Var2) {
                                  pPVar62 = get_val_pockle(in);
                                  sVar15 = pockle_mark(pPVar62);
                                  goto LAB_0010b5ab;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"pockle_release");
                                if (_Var2) {
                                  pPVar62 = get_val_pockle(in);
                                  uVar16 = get_uint(in);
                                  pockle_release(pPVar62,uVar16);
                                  return;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"pockle_add_small_prime");
                                if (_Var2) {
                                  pPVar62 = get_val_pockle(in);
                                  pmVar14 = get_val_mpint(in);
                                  status = pockle_add_small_prime(pPVar62,pmVar14);
LAB_0010f567:
                                  return_pocklestatus(out,status);
                                  return;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"pockle_add_prime");
                                if (_Var2) {
                                  pPVar62 = get_val_pockle(in);
                                  pmVar14 = get_val_mpint(in);
                                  uVar16 = get_uint(in);
                                  ppmVar28 = (mp_int **)safemalloc(uVar16,8,0);
                                  for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
                                    pmVar18 = get_val_mpint(in);
                                    ppmVar28[uVar17] = pmVar18;
                                  }
                                  add_finaliser(finaliser_sfree,ppmVar28);
                                  pmVar18 = get_val_mpint(in);
                                  status = pockle_add_prime(pPVar62,pmVar14,ppmVar28,uVar16,pmVar18)
                                  ;
                                  goto LAB_0010f567;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"pockle_mpu");
                                if (_Var2) {
                                  pPVar62 = get_val_pockle(in);
                                  pmVar14 = get_val_mpint(in);
                                  psVar12 = pockle_mpu(pPVar62,pmVar14);
                                  goto LAB_0010b019;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"miller_rabin_new");
                                if (_Var2) {
                                  pmVar14 = get_val_mpint(in);
                                  pMVar63 = miller_rabin_new(pmVar14);
                                  return_val_millerrabin(out,pMVar63);
                                  return;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"miller_rabin_test");
                                if (_Var2) {
                                  pVVar11 = get_value(in);
                                  if (pVVar11->type == VT_millerrabin) {
                                    pMVar63 = (pVVar11->field_2).vu_millerrabin;
                                    pmVar14 = get_val_mpint(in);
                                    mVar64 = miller_rabin_test(pMVar63,pmVar14);
                                    if (mVar64.passed == 0) {
                                      pcVar66 = "failed\n";
                                    }
                                    else if ((ulong)mVar64 >> 0x20 == 0) {
                                      pcVar66 = "passed\n";
                                    }
                                    else {
                                      pcVar66 = "passed+ppr\n";
                                    }
                                    goto LAB_0010aeab;
                                  }
                                  uVar7 = string_length_for_printf((pVVar11->id).len);
                                  pvVar37 = (pVVar11->id).ptr;
                                  pcVar66 = type_names[pVVar11->type];
                                  pcVar65 = "millerrabin";
                                  goto LAB_0010f6a8;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"ecdsa_public");
                                if (_Var2) {
                                  pmVar14 = get_val_mpint(in);
                                  psVar39 = get_keyalg(in);
                                  pWVar26 = ecdsa_public(pmVar14,psVar39);
                                  goto LAB_0010f663;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"eddsa_public");
                                if (_Var2) {
                                  pmVar14 = get_val_mpint(in);
                                  psVar39 = get_keyalg(in);
                                  pEVar33 = eddsa_public(pmVar14,psVar39);
                                  goto LAB_0010f701;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"des_encrypt_xdmauth");
                                if (_Var2) {
                                  pVar69 = get_val_string_ptrlen(in);
                                  pVar70 = get_val_string_ptrlen(in);
                                  psVar12 = des_encrypt_xdmauth_wrapper(pVar69,pVar70);
                                  goto LAB_0010b019;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"des_decrypt_xdmauth");
                                if (_Var2) {
                                  pVar69 = get_val_string_ptrlen(in);
                                  pVar70 = get_val_string_ptrlen(in);
                                  psVar12 = des_decrypt_xdmauth_wrapper(pVar69,pVar70);
                                  goto LAB_0010b019;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"des3_encrypt_pubkey");
                                if (_Var2) {
                                  pVar69 = get_val_string_ptrlen(in);
                                  pVar70 = get_val_string_ptrlen(in);
                                  psVar12 = des3_encrypt_pubkey_wrapper(pVar69,pVar70);
                                  goto LAB_0010b019;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"des3_decrypt_pubkey");
                                if (_Var2) {
                                  pVar69 = get_val_string_ptrlen(in);
                                  pVar70 = get_val_string_ptrlen(in);
                                  psVar12 = des3_decrypt_pubkey_wrapper(pVar69,pVar70);
                                  goto LAB_0010b019;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"des3_encrypt_pubkey_ossh");
                                if (_Var2) {
                                  pVar69 = get_val_string_ptrlen(in);
                                  pVar70 = get_val_string_ptrlen(in);
                                  pVar71 = get_val_string_ptrlen(in);
                                  psVar12 = des3_encrypt_pubkey_ossh_wrapper(pVar69,pVar70,pVar71);
                                  goto LAB_0010b019;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"des3_decrypt_pubkey_ossh");
                                if (_Var2) {
                                  pVar69 = get_val_string_ptrlen(in);
                                  pVar70 = get_val_string_ptrlen(in);
                                  pVar71 = get_val_string_ptrlen(in);
                                  psVar12 = des3_decrypt_pubkey_ossh_wrapper(pVar69,pVar70,pVar71);
                                  goto LAB_0010b019;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"aes256_encrypt_pubkey");
                                if (_Var2) {
                                  pVar69 = get_val_string_ptrlen(in);
                                  pVar70 = get_val_string_ptrlen(in);
                                  pVar71 = get_val_string_ptrlen(in);
                                  psVar12 = aes256_encrypt_pubkey_wrapper(pVar69,pVar70,pVar71);
                                  goto LAB_0010b019;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"aes256_decrypt_pubkey");
                                if (_Var2) {
                                  pVar69 = get_val_string_ptrlen(in);
                                  pVar70 = get_val_string_ptrlen(in);
                                  pVar71 = get_val_string_ptrlen(in);
                                  psVar12 = aes256_decrypt_pubkey_wrapper(pVar69,pVar70,pVar71);
                                  goto LAB_0010b019;
                                }
                                _Var2 = ptrlen_eq_string(pVar69,"crc32_rfc1662");
                                if (_Var2) {
                                  pVar69 = get_val_string_ptrlen(in);
                                  uVar7 = crc32_rfc1662(pVar69);
                                }
                                else {
                                  _Var2 = ptrlen_eq_string(pVar69,"crc32_ssh1");
                                  if (_Var2) {
                                    pVar69 = get_val_string_ptrlen(in);
                                    uVar7 = crc32_ssh1(pVar69);
                                  }
                                  else {
                                    _Var2 = ptrlen_eq_string(pVar69,"crc32_update");
                                    if (!_Var2) {
                                      _Var2 = ptrlen_eq_string(pVar69,"crcda_detect");
                                      if (_Var2) {
                                        pVar69 = get_val_string_ptrlen(in);
                                        pVar70 = get_val_string_ptrlen(in);
                                        _Var2 = crcda_detect(pVar69,pVar70);
                                        goto LAB_0010fa52;
                                      }
                                      _Var2 = ptrlen_eq_string(pVar69,"get_implementations_commasep"
                                                              );
                                      if (_Var2) {
                                        pVar69 = get_val_string_ptrlen(in);
                                        psVar12 = get_implementations_commasep(pVar69);
                                        goto LAB_0010b019;
                                      }
                                      _Var2 = ptrlen_eq_string(pVar69,"http_digest_response");
                                      if (!_Var2) {
                                        _Var2 = ptrlen_eq_string(pVar69,"random_queue");
                                        if (_Var2) {
                                          pVar69 = get_val_string_ptrlen(in);
                                          bufchain_add(&random_data_queue,pVar69.ptr,pVar69.len);
                                          return;
                                        }
                                        _Var2 = ptrlen_eq_string(pVar69,"random_queue_len");
                                        if (!_Var2) {
                                          _Var2 = ptrlen_eq_string(pVar69,"random_make_prng");
                                          if (!_Var2) {
                                            _Var2 = ptrlen_eq_string(pVar69,"random_clear");
                                            if (!_Var2) {
                                              uVar7 = string_length_for_printf(pVar69.len);
                                              fatal_error("command \'%.*s\': unrecognised",
                                                          (ulong)uVar7,pBVar41);
                                            }
                                            random_clear();
                                            return;
                                          }
                                          psVar35 = get_hashalg(in);
                                          pVar69 = get_val_string_ptrlen(in);
                                          random_clear();
                                          test_prng = prng_new(psVar35);
                                          prng_seed_begin(test_prng);
                                          BinarySink_put_datapl(test_prng->binarysink_,pVar69);
                                          ppVar55 = test_prng;
                                          goto LAB_0010fd29;
                                        }
                                        sVar15 = bufchain_size(&random_data_queue);
                                        goto LAB_0010b5ab;
                                      }
                                      in_00 = &_args;
                                      memset(in_00,0,0x100);
                                      _args.response =
                                           get_out_val_string_binarysink((BinarySource *)in_00);
                                      _args.username = get_val_string_ptrlen(in);
                                      _args.password = get_val_string_ptrlen(in);
                                      _args.realm = get_val_string_ptrlen(in);
                                      _args.method = get_val_string_ptrlen(in);
                                      _args.uri = get_val_string_ptrlen(in);
                                      _args.qop = get_val_string_ptrlen(in);
                                      _args.nonce = get_val_string_ptrlen(in);
                                      _args.opaque = get_val_string_ptrlen(in);
                                      _args.nonce_count = get_uint(in);
                                      pVar69 = get_word(in);
                                      pvVar37 = pVar69.ptr;
                                      _Var2 = enum_translate_httpdigesthash
                                                        (pVar69,(TD_httpdigesthash *)local_180);
                                      if (_Var2) {
                                        _args.hash = _local_180;
                                        _args.hash_username = get_boolean(in);
                                        http_digest_response
                                                  (_args.response,_args.username,_args.password,
                                                   _args.realm,_args.method,_args.uri,_args.qop,
                                                   _args.nonce,_args.opaque,
                                                   (uint32_t)_args.nonce_count,_local_180,
                                                   _args.hash_username);
                                        return;
                                      }
                                      uVar7 = string_length_for_printf(pVar69.len);
                                      pcVar66 = "httpdigesthash";
                                      uVar13 = (ulong)uVar7;
                                      goto LAB_0010fc93;
                                    }
                                    uVar16 = get_uint(in);
                                    pVar69 = get_val_string_ptrlen(in);
                                    uVar7 = crc32_update((uint32_t)uVar16,pVar69);
                                  }
                                }
                                goto LAB_0010b5a6;
                              }
                              pVar69 = get_word(in);
                              pvVar37 = pVar69.ptr;
                              _Var2 = enum_translate_primegenpolicy
                                                (pVar69,(TD_primegenpolicy *)&_args);
                              if (_Var2) {
                                pPVar60 = (PrimeGenerationContext *)(**(code **)(_args._0_8_ + 8))()
                                ;
                                return_val_pgc(out,pPVar60);
                                return;
                              }
                              uVar7 = string_length_for_printf(pVar69.len);
                              pcVar66 = "primegenpolicy";
                            }
                            goto LAB_0010f09f;
                          }
                          pRVar54 = get_val_rsakex(in);
                          iVar8 = ssh_rsakex_klen(pRVar54);
                        }
                        goto LAB_0010e417;
                      }
                      pVar69 = get_word(in);
                      pvVar37 = pVar69.ptr;
                      _Var2 = enum_translate_dh_group(pVar69,(TD_dh_group *)&_args);
                      if (_Var2) {
                        pdVar47 = dh_setup_group((ssh_kex *)_args._0_8_);
                        return_val_dh(out,pdVar47);
                        return;
                      }
                      uVar7 = string_length_for_printf(pVar69.len);
                      pcVar66 = "dh_group";
                    }
LAB_0010f09f:
                    uVar13 = (ulong)uVar7;
LAB_0010fc93:
                    fatal_error("%s \'%.*s\': not found",pcVar66,uVar13,pvVar37);
                  }
                  pkVar44 = get_val_keycomponents(in);
                  uVar16 = get_uint(in);
                  if ((uVar16 < pkVar44->ncomponents) &&
                     (pcVar66 = pkVar44->components[uVar16].name, pcVar66 != (char *)0x0))
                  goto LAB_0010da39;
                }
                pcVar66 = "NULL\n";
LAB_0010aeab:
                BinarySink_put_fmt(out->binarysink_,pcVar66);
                return;
              }
              pWVar26 = get_val_wpoint(in);
              uVar7 = ecc_weierstrass_is_identity(pWVar26);
            }
          }
        }
      }
    }
  }
LAB_0010b5a6:
  sVar15 = (size_t)uVar7;
LAB_0010b5ab:
  return_uint(out,sVar15);
  return;
}

Assistant:

static void process_line(BinarySource *in, strbuf *out)
{
    ptrlen id = get_word(in);

#define DISPATCH_INTERNAL(cmdname, handler) do {        \
        if (ptrlen_eq_string(id, cmdname)) {            \
            handler(in, out);                           \
            return;                                     \
        }                                               \
    } while (0)

#define DISPATCH_COMMAND(cmd) DISPATCH_INTERNAL(#cmd, handle_##cmd)
    DISPATCH_COMMAND(hello);
    DISPATCH_COMMAND(free);
    DISPATCH_COMMAND(newstring);
    DISPATCH_COMMAND(getstring);
    DISPATCH_COMMAND(mp_literal);
    DISPATCH_COMMAND(mp_dump);
    DISPATCH_COMMAND(checkenum);
#undef DISPATCH_COMMAND

#define FUNC_INNER(outtype, fname, realname, ...)       \
    DISPATCH_INTERNAL(#fname,handle_##fname);
#define ARG1(type, arg)
#define ARGN(type, arg)
#define VOID
#include "testcrypt-func.h"
#undef FUNC_INNER
#undef ARG
#undef VOID

#undef DISPATCH_INTERNAL

    fatal_error("command '%.*s': unrecognised", PTRLEN_PRINTF(id));
}